

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportSleep(TranslateToFuzzReader *this,Type type)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Call *pCVar1;
  Type local_a0 [3];
  allocator<wasm::Expression_*> local_81;
  Expression *local_80;
  Expression *local_78;
  iterator local_70;
  size_type local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  size_t local_48;
  char *pcStack_40;
  Type local_38;
  Expression *local_30;
  Expression *id;
  Expression *local_20;
  Expression *ms;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ms = (Expression *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  Type::Type((Type *)&id,i32);
  local_20 = make(this,(Type)id);
  Type::Type(&local_38,i32);
  local_78 = make(this,local_38);
  local_48 = (this->sleepImportName).super_IString.str._M_len;
  pcStack_40 = (this->sleepImportName).super_IString.str._M_str;
  local_80 = local_20;
  local_70 = &local_80;
  local_68 = 2;
  local_30 = local_78;
  std::allocator<wasm::Expression_*>::allocator(&local_81);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_60,__l,&local_81);
  Type::Type(local_a0,i32);
  target.super_IString.str._M_str = pcStack_40;
  target.super_IString.str._M_len = local_48;
  pCVar1 = Builder::makeCall(&this->builder,target,&local_60,local_a0[0],false);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_60);
  std::allocator<wasm::Expression_*>::~allocator(&local_81);
  return (Expression *)pCVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportSleep(Type type) {
  // Sleep for some ms, and return a given id.
  auto* ms = make(Type::i32);
  auto id = make(Type::i32);
  return builder.makeCall(sleepImportName, {ms, id}, Type::i32);
}